

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::UTF8CoerceToStructurallyValid
          (internal *this,StringPiece src_str,char *idst,char replace_char)

{
  int iVar1;
  char *__src;
  stringpiece_ssize_type sVar2;
  char *offset;
  void *__dest;
  stringpiece_ssize_type extraout_RDX;
  stringpiece_ssize_type extraout_RDX_00;
  StringPiece str;
  StringPiece str_00;
  undefined1 local_78 [8];
  StringPiece str2;
  char *dst;
  char *srclimit;
  char *src;
  int n;
  int len;
  char *isrc;
  char replace_char_local;
  char *idst_local;
  StringPiece src_str_local;
  
  __dest = (void *)src_str.length_;
  src_str_local.ptr_ = src_str.ptr_;
  idst_local = (char *)this;
  __src = StringPiece::data((StringPiece *)&idst_local);
  sVar2 = StringPiece::length((StringPiece *)&idst_local);
  str.length_ = extraout_RDX;
  str.ptr_ = src_str_local.ptr_;
  iVar1 = UTF8SpnStructurallyValid((internal *)idst_local,str);
  src_str_local.length_ = (stringpiece_ssize_type)__src;
  if (iVar1 != (int)sVar2) {
    str2.length_ = (stringpiece_ssize_type)__dest;
    memmove(__dest,__src,(long)iVar1);
    str2.length_ = str2.length_ + iVar1;
    srclimit = __src + iVar1;
    while (src_str_local.length_ = (stringpiece_ssize_type)__dest, srclimit < __src + (int)sVar2) {
      *(char *)str2.length_ = (char)idst;
      offset = srclimit + 1;
      str2.length_ = str2.length_ + 1;
      StringPiece::StringPiece
                ((StringPiece *)local_78,offset,(long)(__src + (int)sVar2) - (long)offset);
      str_00.length_ = extraout_RDX_00;
      str_00.ptr_ = str2.ptr_;
      iVar1 = UTF8SpnStructurallyValid((internal *)local_78,str_00);
      memmove((void *)str2.length_,offset,(long)iVar1);
      str2.length_ = str2.length_ + iVar1;
      srclimit = offset + iVar1;
    }
  }
  return (char *)src_str_local.length_;
}

Assistant:

char* UTF8CoerceToStructurallyValid(StringPiece src_str, char* idst,
                                    const char replace_char) {
  const char* isrc = src_str.data();
  const int len = src_str.length();
  int n = UTF8SpnStructurallyValid(src_str);
  if (n == len) {               // Normal case -- all is cool, return
    return const_cast<char*>(isrc);
  } else {                      // Unusual case -- copy w/o bad bytes
    const char* src = isrc;
    const char* srclimit = isrc + len;
    char* dst = idst;
    memmove(dst, src, n);       // Copy initial good chunk
    src += n;
    dst += n;
    while (src < srclimit) {    // src points to bogus byte or is off the end
      dst[0] = replace_char;                    // replace one bad byte
      src++;
      dst++;
      StringPiece str2(src, srclimit - src);
      n = UTF8SpnStructurallyValid(str2);       // scan the remainder
      memmove(dst, src, n);                     // copy next good chunk
      src += n;
      dst += n;
    }
  }
  return idst;
}